

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::root(precise_unit *un,int power)

{
  precise_unit pVar1;
  int in_ESI;
  precise_unit *in_RDI;
  double dVar2;
  int in_stack_00000044;
  unit_data *in_stack_00000048;
  undefined8 in_stack_ffffffffffffffd0;
  int power_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  unit_data local_20;
  int local_1c;
  precise_unit *local_18;
  precise_unit local_10;
  
  power_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  if (in_ESI == 0) {
    local_10.multiplier_ = 1.0;
    local_10.base_units_ = (unit_data)0x0;
    local_10.commodity_ = 0;
  }
  else {
    local_1c = in_ESI;
    local_18 = in_RDI;
    dVar2 = precise_unit::multiplier(in_RDI);
    if ((0.0 <= dVar2) || (local_1c % 2 != 0)) {
      precise_unit::multiplier(local_18);
      dVar2 = numericalRoot<double>
                        ((double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         power_00);
      precise_unit::base_units(local_18);
      local_20 = detail::unit_data::root(in_stack_00000048,in_stack_00000044);
      precise_unit::precise_unit(&local_10,dVar2,&local_20);
    }
    else {
      local_10.multiplier_ = NAN;
      local_10.base_units_ = (unit_data)0xfa94a488;
      local_10.commodity_ = 0;
    }
  }
  pVar1.base_units_ = local_10.base_units_;
  pVar1.commodity_ = local_10.commodity_;
  pVar1.multiplier_ = local_10.multiplier_;
  return pVar1;
}

Assistant:

precise_unit root(const precise_unit& un, int power)
{
    if (power == 0) {
        return precise::one;
    }
    if (un.multiplier() < 0.0 && power % 2 == 0) {
        return precise::invalid;
    }
    return precise_unit{
        numericalRoot(un.multiplier(), power), un.base_units().root(power)};
}